

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFiveAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomFiveAction::Use(BlueRoomFiveAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  string *this_00;
  allocator local_51;
  string local_50;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == TORCH) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string((string *)&local_30,"You\'ve already used the torch.",&local_51);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_30);
    this_00 = &local_30;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != STATUE) {
      pAVar2 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
      return pAVar2;
    }
    pAVar2 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_50,
               "The statue awaits your action. You attempt to trigger its innate action. Kind of a stand off I guess. Maybe try something else?"
               ,&local_51);
    ActionResults::ActionResults(pAVar2,CURRENT,&local_50);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  return pAVar2;
}

Assistant:

ActionResults *BlueRoomFiveAction::Use() {
    if(commands->getMainItem() == TORCH) {
        return new ActionResults(CURRENT, "You've already used the torch.");
    }else if(commands->getMainItem() == STATUE){
        return new ActionResults(CURRENT, "The statue awaits your action. You attempt to trigger its innate action. Kind of a stand off I guess. Maybe try something else?");
    }else {
        return AbstractRoomAction::Use();
    }
}